

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::sbc_a_mhl(CPU *this)

{
  uint8_t *puVar1;
  ushort uVar2;
  Registers *pRVar3;
  Registers *pRVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint8_t uVar8;
  uint uVar9;
  
  pRVar3 = this->regs;
  uVar2._0_1_ = pRVar3->h;
  uVar2._1_1_ = pRVar3->l;
  uVar5 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  pRVar4 = this->regs;
  uVar9 = pRVar4->f >> 4 & 1;
  pRVar4->f = '@';
  bVar7 = pRVar3->a;
  if ((int)(bVar7 & 0xf) < (int)((uVar5 & 0xf) - uVar9)) {
    pRVar4->f = '`';
    bVar7 = pRVar3->a;
    uVar8 = 'p';
  }
  else {
    uVar8 = 'P';
  }
  iVar6 = (uVar5 & 0xff) - uVar9;
  if ((int)(uint)bVar7 < iVar6) {
    pRVar4->f = uVar8;
    bVar7 = pRVar3->a;
  }
  uVar8 = bVar7 - (char)iVar6;
  pRVar3->a = uVar8;
  if (uVar8 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 2;
}

Assistant:

int CPU::sbc_a_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    sbc_r8_r8(regs.a, mmu.read_byte(addr));
    return 2;
}